

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O3

void logging_tests::logging_LogPrintMacros_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  logging_LogPrintMacros t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 local_6b8 [112];
  ios_base local_648 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  undefined1 local_520 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [26];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_6c0 = "";
  memset((ostringstream *)local_520,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_520);
  local_3a8[0]._M_string_length = 0;
  local_3a8[0].field_2._M_local_buf[0] = '\0';
  local_6b8[0] = (ostringstream)0x22;
  local_3a8[0]._M_dataplus._M_p = (pointer)&local_3a8[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_520,local_6b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_520,"logging_LogPrintMacros",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_520,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_3a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8);
  if ((undefined1 *)CONCAT71(local_6b8._1_7_,local_6b8[0]) != local_6b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_6b8._1_7_,local_6b8[0]),local_6b8._16_8_ + 1);
  }
  local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8[0]._M_dataplus._M_p;
  local_6d0 = local_3a8[0]._M_dataplus._M_p + local_3a8[0]._M_string_length;
  file.m_end = (iterator)0x86;
  file.m_begin = (iterator)&local_6c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_6d8,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8[0]._M_dataplus._M_p != &local_3a8[0].field_2) {
    operator_delete(local_3a8[0]._M_dataplus._M_p,
                    CONCAT71(local_3a8[0].field_2._M_allocated_capacity._1_7_,
                             local_3a8[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_520);
  std::ios_base::~ios_base((ios_base *)(local_520 + 0x70));
  LogSetup::LogSetup((LogSetup *)local_520);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_6e0 = "";
  memset((ostringstream *)local_6b8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
  paVar1 = &local_540.field_2;
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_540._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b8,"logging_LogPrintMacros",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_540,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p;
  local_6f0 = local_540._M_dataplus._M_p + local_540._M_string_length;
  file_00.m_end = (iterator)0x86;
  file_00.m_begin = (iterator)&local_6e8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6f8,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != paVar1) {
    operator_delete(local_540._M_dataplus._M_p,
                    CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                             local_540.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
  std::ios_base::~ios_base(local_648);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_700 = "";
  memset((ostringstream *)local_6b8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_540._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b8,"logging_LogPrintMacros",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_540,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_718 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p;
  local_710 = local_540._M_dataplus._M_p + local_540._M_string_length;
  file_01.m_end = (iterator)0x86;
  file_01.m_begin = (iterator)&local_708;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_718,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != paVar1) {
    operator_delete(local_540._M_dataplus._M_p,
                    CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                             local_540.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
  std::ios_base::~ios_base(local_648);
  logging_LogPrintMacros::test_method((logging_LogPrintMacros *)local_520);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_720 = "";
  memset((ostringstream *)local_6b8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_540._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b8,"logging_LogPrintMacros",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b8,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_540,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_738 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p;
  local_730 = local_540._M_dataplus._M_p + local_540._M_string_length;
  file_02.m_end = (iterator)0x86;
  file_02.m_begin = (iterator)&local_728;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_738,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != paVar1) {
    operator_delete(local_540._M_dataplus._M_p,
                    CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                             local_540.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
  std::ios_base::~ios_base(local_648);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_740 = "";
  memset((ostringstream *)local_6b8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_540._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b8,"logging_LogPrintMacros",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_540,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_758 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p;
  local_750 = local_540._M_dataplus._M_p + local_540._M_string_length;
  file_03.m_end = (iterator)0x86;
  file_03.m_begin = (iterator)&local_748;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_758,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != paVar1) {
    operator_delete(local_540._M_dataplus._M_p,
                    CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                             local_540.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
  std::ios_base::~ios_base(local_648);
  LogSetup::~LogSetup((LogSetup *)local_520);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros, LogSetup)
{
    LogTrace(BCLog::NET, "foo6: %s\n", "bar6"); // not logged
    LogDebug(BCLog::NET, "foo7: %s\n", "bar7");
    LogInfo("foo8: %s\n", "bar8");
    LogWarning("foo9: %s\n", "bar9");
    LogError("foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[net] foo7: bar7",
        "foo8: bar8",
        "[warning] foo9: bar9",
        "[error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}